

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall mpt::reference<mpt::layout::text>::type::type(type *this,uintptr_t initial)

{
  uintptr_t initial_local;
  type *this_local;
  
  layout::text::text(&this->super_text,(text *)0x0);
  (this->super_text).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0017c7c0;
  (this->super_text).super_object._vptr_object = (_func_int **)&PTR_property_0017c810;
  refcount::refcount(&this->_ref,initial);
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }